

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNQOut.cpp
# Opt level: O2

void __thiscall NaPNQueueOutput::action(NaPNQueueOutput *this)

{
  NaReal NVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  NaVector *pNVar5;
  undefined4 extraout_var;
  NaReal *pNVar6;
  NaVector *pNVar7;
  undefined4 extraout_var_00;
  
  if (this->nQLimit == 0) {
    uVar2 = 0;
    while( true ) {
      uVar4 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[0x15])(this);
      if (uVar4 <= uVar2) break;
      pNVar7 = NaPetriCnInput::data(&this->in);
      iVar3 = (*pNVar7->_vptr_NaVector[8])(pNVar7,(ulong)uVar2);
      NVar1 = *(NaReal *)CONCAT44(extraout_var_00,iVar3);
      pNVar6 = NaVector::operator[](&this->vQueue,uVar2);
      *pNVar6 = NVar1;
      uVar2 = uVar2 + 1;
    }
  }
  else {
    pNVar7 = &this->vQueue;
    uVar2 = NaVector::dim(pNVar7);
    iVar3 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[0x15])(this);
    NaVector::new_dim(pNVar7,uVar2 + iVar3);
    uVar2 = 0;
    while( true ) {
      uVar4 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[0x15])(this);
      if (uVar4 <= uVar2) break;
      pNVar5 = NaPetriCnInput::data(&this->in);
      iVar3 = (*pNVar5->_vptr_NaVector[8])(pNVar5,(ulong)uVar2);
      NVar1 = *(NaReal *)CONCAT44(extraout_var,iVar3);
      uVar4 = NaVector::dim(pNVar7);
      iVar3 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[0x15])(this);
      pNVar6 = NaVector::operator[](pNVar7,(uVar4 - iVar3) + uVar2);
      *pNVar6 = NVar1;
      uVar2 = uVar2 + 1;
    }
  }
  return;
}

Assistant:

void
NaPNQueueOutput::action ()
{
  unsigned	i;

  if(nQLimit > 0){
    vQueue.new_dim(vQueue.dim() + get_data_dim());

    for(i = 0; i < get_data_dim(); ++i){
      vQueue[vQueue.dim() + i - get_data_dim()] = in.data()[i];
    }
  }else for(i = 0; i < get_data_dim(); ++i){
    vQueue[i] = in.data()[i];
  }
}